

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O1

CMDPSTATE * __thiscall RSTARPlanner::GetState(RSTARPlanner *this,int stateID)

{
  DiscreteSpaceInformation *pDVar1;
  pointer ppiVar2;
  long lVar3;
  CMDPSTATE *pCVar4;
  ostream *poVar5;
  runtime_error *this_00;
  stringstream ss;
  long *local_1c8 [2];
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  pDVar1 = (this->super_SBPLPlanner).environment_;
  ppiVar2 = (pDVar1->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(pDVar1->StateID2IndexMapping).
                          super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppiVar2) >> 3) <= stateID) {
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"ERROR int GetState: stateID ","");
    std::__cxx11::stringstream::stringstream(local_1a8,(string *)local_1c8,_S_out|_S_in);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    poVar5 = (ostream *)std::ostream::operator<<(local_198,stateID);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," is invalid",0xb);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,(string *)local_1c8);
    *(undefined ***)this_00 = &PTR__runtime_error_001574d0;
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar3 = (long)*ppiVar2[stateID];
  if (lVar3 != -1) {
    return (this->pSearchStateSpace->searchMDP).StateArray.
           super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar3];
  }
  pCVar4 = CreateState(this,stateID);
  return pCVar4;
}

Assistant:

CMDPSTATE* RSTARPlanner::GetState(int stateID)
{
    if (stateID >= (int)environment_->StateID2IndexMapping.size()) {
        SBPL_ERROR("ERROR int GetState: stateID %d is invalid\n", stateID);
        std::stringstream ss("ERROR int GetState: stateID ");
        ss << stateID << " is invalid";
        throw SBPL_Exception(ss.str());
    }

    if (environment_->StateID2IndexMapping[stateID][RSTARMDP_STATEID2IND] == -1)
        return CreateState(stateID);
    else
        return pSearchStateSpace->searchMDP.StateArray[environment_->StateID2IndexMapping[stateID][RSTARMDP_STATEID2IND]];
}